

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

int run_test(int inprocess)

{
  int iVar1;
  undefined8 uVar2;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_88 [4];
  int r;
  uv_thread_t tid;
  uv_process_t process;
  int inprocess_local;
  
  process._100_4_ = inprocess;
  if (inprocess == 0) {
    spawn_helper(&ctx.channel,(uv_process_t *)&tid,"ipc_send_recv_helper");
    connect_cb(&ctx.connect_req,0);
  }
  else {
    iVar1 = uv_thread_create(local_88,ipc_send_recv_helper_threadproc,0x2a);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
              ,0xb3,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_sleep(1000);
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,&ctx,1);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
              ,0xb8,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    uv_pipe_connect(0x34b2a8,&ctx,"/tmp/uv-test-sock3",connect_cb);
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_run(uVar2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
            ,0xc2,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)recv_cb_count == 2) {
    if (process._100_4_ != 0) {
      iVar1 = uv_thread_join(local_88);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
                ,200,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
    }
    return 0;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-send-recv.c"
          ,0xc4,"2","==","recv_cb_count",2,"==",(long)recv_cb_count);
  abort();
}

Assistant:

int run_test(const char* test,
             int benchmark_output,
             int test_count) {
  char errmsg[1024] = "";
  process_info_t processes[1024];
  process_info_t *main_proc;
  task_entry_t* task;
  int timeout_multiplier;
  int process_count;
  int result;
  int status;
  int i;

  status = 255;
  main_proc = NULL;
  process_count = 0;

#ifndef _WIN32
  /* Clean up stale socket from previous run. */
  remove(TEST_PIPENAME);
  remove(TEST_PIPENAME_2);
  remove(TEST_PIPENAME_3);
#endif

  /* If it's a helper the user asks for, start it directly. */
  for (task = TASKS; task->main; task++) {
    if (task->is_helper && strcmp(test, task->process_name) == 0) {
      return task->main();
    }
  }

  /* Start the helpers first. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    /* Skip the test itself. */
    if (!task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      1 /* is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    process_count++;
  }

  /* Now start the test itself. */
  for (task = TASKS; task->main; task++) {
    if (strcmp(test, task->task_name) != 0) {
      continue;
    }

    if (task->is_helper) {
      continue;
    }

    if (process_start(task->task_name,
                      task->process_name,
                      &processes[process_count],
                      0 /* !is_helper */) == -1) {
      snprintf(errmsg,
               sizeof errmsg,
               "Process `%s` failed to start.",
               task->process_name);
      goto out;
    }

    main_proc = &processes[process_count];
    process_count++;
    break;
  }

  if (main_proc == NULL) {
    snprintf(errmsg,
             sizeof errmsg,
             "No test with that name: %s",
             test);
    goto out;
  }

  timeout_multiplier = 1;
#ifndef _WIN32
  do {
    const char* var;

    var = getenv("UV_TEST_TIMEOUT_MULTIPLIER");
    if (var == NULL)
      break;

    timeout_multiplier = atoi(var);
    if (timeout_multiplier <= 0)
      timeout_multiplier = 1;
  } while (0);
#endif

  result = process_wait(main_proc, 1, task->timeout * timeout_multiplier);
  if (result == -1) {
    FATAL("process_wait failed");
  } else if (result == -2) {
    /* Don't have to clean up the process, process_wait() has killed it. */
    snprintf(errmsg,
             sizeof errmsg,
             "timeout");
    goto out;
  }

  status = process_reap(main_proc);
  if (status != TEST_OK) {
    snprintf(errmsg,
             sizeof errmsg,
             "exit code %d",
             status);
    goto out;
  }

  if (benchmark_output) {
    /* Give the helpers time to clean up their act. */
    uv_sleep(1000);
  }

out:
  /* Reap running processes except the main process, it's already dead. */
  for (i = 0; i < process_count - 1; i++) {
    process_terminate(&processes[i]);
  }

  if (process_count > 0 &&
      process_wait(processes, process_count - 1, -1) < 0) {
    FATAL("process_wait failed");
  }

  log_tap_result(test_count, test, status, &processes[i]);

  /* Show error and output from processes if the test failed. */
  if ((status != TEST_OK && status != TEST_SKIP) || task->show_output) {
    if (strlen(errmsg) > 0)
      fprintf(stdout, "# %s\n", errmsg);
    fprintf(stdout, "# ");
    fflush(stdout);

    for (i = 0; i < process_count; i++) {
      switch (process_output_size(&processes[i])) {
       case -1:
        fprintf(stdout, "Output from process `%s`: (unavailable)\n",
                process_get_name(&processes[i]));
        fflush(stdout);
        break;

       case 0:
        fprintf(stdout, "Output from process `%s`: (no output)\n",
                process_get_name(&processes[i]));
        fflush(stdout);
        break;

       default:
        fprintf(stdout, "Output from process `%s`:\n", process_get_name(&processes[i]));
        fflush(stdout);
        process_copy_output(&processes[i], stdout);
        break;
      }
    }

  /* In benchmark mode show concise output from the main process. */
  } else if (benchmark_output) {
    switch (process_output_size(main_proc)) {
     case -1:
      fprintf(stdout, "%s: (unavailable)\n", test);
      fflush(stdout);
      break;

     case 0:
      fprintf(stdout, "%s: (no output)\n", test);
      fflush(stdout);
      break;

     default:
      for (i = 0; i < process_count; i++) {
        process_copy_output(&processes[i], stdout);
      }
      break;
    }
  }

  /* Clean up all process handles. */
  for (i = 0; i < process_count; i++) {
    process_cleanup(&processes[i]);
  }

  return status;
}